

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O2

int __thiscall TPZCheckMesh::CheckConnectOrderConsistency(TPZCheckMesh *this)

{
  uint uVar1;
  int nstate;
  int iVar2;
  int iVar3;
  TPZCompEl **ppTVar4;
  long *plVar5;
  TPZConnect *this_00;
  ostream *poVar6;
  ulong uVar7;
  int iVar8;
  ulong nelem;
  
  uVar1 = (uint)(this->fMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  nstate = (**(code **)(*(long *)(this->fMesh->fMaterialVec)._M_t._M_impl.super__Rb_tree_header.
                                 _M_header._M_left[1]._M_parent + 0x78))();
  nelem = 0;
  uVar7 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar7 = nelem;
  }
  do {
    if (nelem == uVar7) {
      return -1;
    }
    ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(this->fMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
    if (*ppTVar4 != (TPZCompEl *)0x0) {
      plVar5 = (long *)__dynamic_cast(*ppTVar4,&TPZCompEl::typeinfo,
                                      &TPZInterpolatedElement::typeinfo,0);
      iVar2 = (**(code **)(*plVar5 + 0x380))(plVar5);
      if (iVar2 == 0) {
LAB_00ff879f:
        (**(code **)(*plVar5 + 200))(plVar5,&std::cout);
        return (int)nelem;
      }
      iVar2 = (**(code **)(*plVar5 + 0x90))(plVar5);
      iVar8 = 0;
      if (iVar2 < 1) {
        iVar2 = iVar8;
      }
      while (iVar2 != iVar8) {
        this_00 = (TPZConnect *)(**(code **)(*plVar5 + 0xa8))(plVar5,iVar8);
        iVar3 = (**(code **)(*plVar5 + 0x260))(plVar5,iVar8,(this_00->field_2).fCompose.fOrder);
        iVar3 = TPZConnect::CheckDependency(this_00,iVar3,this->fMesh,nstate);
        iVar8 = iVar8 + 1;
        if (iVar3 == -1) {
          poVar6 = std::operator<<((ostream *)&std::cout,"TPZCheckMesh inconsistent dependency");
          std::endl<char,std::char_traits<char>>(poVar6);
          goto LAB_00ff879f;
        }
      }
    }
    nelem = nelem + 1;
  } while( true );
}

Assistant:

int TPZCheckMesh::CheckConnectOrderConsistency() {
	
	int nel = fMesh->ElementVec().NElements();
	int nstate = (fMesh->MaterialVec().begin()->second)->NStateVariables();
	int iel;
	for(iel = 0; iel<nel; iel++) {
		TPZCompEl *cel = fMesh->ElementVec()[iel];
		if(!cel) continue;
		TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(cel);
		if(!intel->CheckElementConsistency()) {
			intel->Print();
			return iel;
		}
		int nc = intel->NConnects();
		int ic;
		for(ic = 0; ic<nc; ic++) {
			TPZConnect &c = intel->Connect(ic);
			int nshape = intel->NConnectShapeF(ic,c.Order());
			if(c.CheckDependency(nshape, fMesh, nstate) == -1) {
				cout << "TPZCheckMesh inconsistent dependency" << endl;
				intel->Print();
				return iel;
			}
		}
	}
	return -1;
}